

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

dxil_spv_result
dxil_spv_create_converter_with_reflection
          (dxil_spv_parsed_blob blob,dxil_spv_parsed_blob reflection_blob,
          dxil_spv_converter *converter)

{
  dxil_spv_converter_s *this;
  dxil_spv_parsed_blob local_50;
  dxil_spv_converter_s *local_38;
  dxil_spv_converter_s *conv;
  dxil_spv_converter *converter_local;
  dxil_spv_parsed_blob reflection_blob_local;
  dxil_spv_parsed_blob blob_local;
  
  this = (dxil_spv_converter_s *)operator_new(0x188,(nothrow_t *)&std::nothrow);
  local_38 = (dxil_spv_converter_s *)0x0;
  if (this != (dxil_spv_converter_s *)0x0) {
    local_50 = reflection_blob;
    if (reflection_blob == (dxil_spv_parsed_blob)0x0) {
      local_50 = (dxil_spv_parsed_blob)0x0;
    }
    dxil_spv_converter_s::dxil_spv_converter_s(this,&blob->bc,&local_50->bc);
    local_38 = this;
  }
  if (local_38 == (dxil_spv_converter_s *)0x0) {
    blob_local._4_4_ = DXIL_SPV_ERROR_OUT_OF_MEMORY;
  }
  else {
    *converter = local_38;
    blob_local._4_4_ = DXIL_SPV_SUCCESS;
  }
  return blob_local._4_4_;
}

Assistant:

dxil_spv_result dxil_spv_create_converter_with_reflection(dxil_spv_parsed_blob blob,
                                                          dxil_spv_parsed_blob reflection_blob,
                                                          dxil_spv_converter *converter)
{
	auto *conv = new (std::nothrow) dxil_spv_converter_s(blob->bc, reflection_blob ? &reflection_blob->bc : nullptr);
	if (!conv)
		return DXIL_SPV_ERROR_OUT_OF_MEMORY;

	*converter = conv;
	return DXIL_SPV_SUCCESS;
}